

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals)

{
  float *pfVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  uint32_t *puVar6;
  HasherCommon *pHVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  float *pfVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  void *__dest;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  StartPosQueue *queue;
  size_t sVar22;
  size_t sVar23;
  ulong uVar24;
  void *pvVar25;
  uint8_t *puVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint8_t *puVar31;
  size_t max_backward_limit;
  ulong uVar32;
  undefined4 *puVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  size_t pos;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  ZopfliNode *nodes;
  ulong local_2808;
  undefined4 *local_2800;
  ulong local_27f8;
  ulong local_27e8;
  ulong local_27b0;
  void *local_27a0;
  void *local_2790;
  long local_2770;
  long local_2768;
  ulong local_2758;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_cmd [704];
  uint32_t histogram_literal [256];
  float cost_literal [256];
  uint32_t histogram_dist [544];
  
  iVar15 = params->lgwin;
  if (num_bytes == 0) {
    bVar42 = false;
    local_2790 = (void *)0x0;
    local_27a0 = (void *)0x0;
  }
  else {
    sVar5 = params->stream_offset;
    local_2758 = num_bytes * 4;
    local_2790 = BrotliAllocate(m,local_2758);
    local_27a0 = (void *)0x0;
    pvVar25 = (void *)(num_bytes - 0x7f);
    if (num_bytes < 0x7f) {
      pvVar25 = local_27a0;
    }
    if (local_2758 != 0) {
      local_27a0 = BrotliAllocate(m,num_bytes << 5);
    }
    bVar42 = 3 < num_bytes;
    if (bVar42) {
      uVar38 = (1L << ((byte)iVar15 & 0x3f)) - 0x10;
      lVar21 = 0;
      lVar29 = 0;
      auVar49 = _DAT_00176480;
      do {
        uVar28 = lVar21 + position;
        uVar27 = uVar38;
        if (uVar28 < uVar38) {
          uVar27 = uVar28;
        }
        uVar32 = sVar5 + uVar28;
        if (uVar38 <= uVar32) {
          uVar32 = uVar38;
        }
        uVar17 = lVar29 + 0x80;
        if (local_2758 < uVar17) {
          uVar18 = local_2758;
          if (local_2758 == 0) {
            uVar18 = uVar17;
          }
          do {
            uVar24 = uVar18;
            uVar18 = uVar24 * 2;
          } while (uVar24 < uVar17);
          __dest = BrotliAllocate(m,uVar24 * 8);
          if (local_2758 != 0) {
            memcpy(__dest,local_27a0,local_2758 << 3);
          }
          BrotliFree(m,local_27a0);
          local_27a0 = __dest;
          auVar49 = _DAT_00176480;
          local_2758 = uVar24;
        }
        uVar24 = num_bytes - lVar21;
        puVar33 = (undefined4 *)((long)local_27a0 + lVar29 * 8);
        uVar17 = uVar28 & ringbuffer_mask;
        uVar18 = 0x10;
        if (params->quality == 0xb) {
          uVar18 = 0x40;
        }
        uVar19 = 0;
        if (uVar18 <= uVar28) {
          uVar19 = uVar28 - uVar18;
        }
        uVar18 = uVar28 - 1;
        uVar37 = 1;
        local_2800 = puVar33;
        if (uVar19 < uVar18) {
          puVar26 = ringbuffer + uVar17;
          uVar40 = (ulong)((uint)uVar24 & 7);
          while (uVar28 - uVar18 <= uVar27) {
            uVar36 = uVar18 & ringbuffer_mask;
            if ((*puVar26 == ringbuffer[uVar36]) && (puVar26[1] == ringbuffer[uVar36 + 1])) {
              if (7 < uVar24) {
                lVar30 = 0;
                uVar34 = 0;
LAB_00122db8:
                if (*(ulong *)(puVar26 + uVar34 * 8) == *(ulong *)(ringbuffer + uVar34 * 8 + uVar36)
                   ) goto code_r0x00122dc5;
                uVar34 = *(ulong *)(ringbuffer + uVar34 * 8 + uVar36) ^
                         *(ulong *)(puVar26 + uVar34 * 8);
                uVar36 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                uVar34 = (uVar36 >> 3 & 0x1fffffff) - lVar30;
                goto LAB_00122de8;
              }
              puVar31 = puVar26;
              uVar41 = 0;
LAB_00122e34:
              uVar34 = uVar41;
              if (uVar40 != 0) {
                uVar39 = uVar40 | uVar41;
                uVar35 = uVar40;
                do {
                  uVar34 = uVar41;
                  if (ringbuffer[uVar41 + uVar36] != *puVar31) break;
                  puVar31 = puVar31 + 1;
                  uVar41 = uVar41 + 1;
                  uVar35 = uVar35 - 1;
                  uVar34 = uVar39;
                } while (uVar35 != 0);
              }
LAB_00122de8:
              if (uVar37 < uVar34) {
                *local_2800 = (int)(uVar28 - uVar18);
                local_2800[1] = (int)uVar34 << 5;
                local_2800 = local_2800 + 2;
                uVar37 = uVar34;
              }
            }
            uVar18 = uVar18 - 1;
            if ((uVar18 <= uVar19) || (2 < uVar37)) break;
          }
        }
        if (uVar37 < uVar24) {
          uVar14 = (uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0xf;
          uVar18 = (hasher->privat)._H5.bucket_size_;
          puVar6 = (hasher->privat)._H2.buckets_;
          pHVar7 = (hasher->privat)._H40.common;
          uVar40 = (ulong)puVar6[uVar14];
          uVar19 = uVar24;
          if (0x7f < uVar24) {
            puVar6[uVar14] = (uint32_t)uVar28;
            uVar19 = 0x80;
          }
          local_2770 = (uVar18 & uVar28) * 2 + 1;
          local_2768 = (uVar18 & uVar28) * 2;
          if (uVar28 != uVar40) {
            lVar30 = 0x40;
            local_27e8 = 0;
            local_27b0 = 0;
LAB_00122f42:
            bVar43 = lVar30 != 0;
            lVar30 = lVar30 + -1;
            if ((uVar28 - uVar40 <= uVar27) && (bVar43)) {
              uVar36 = local_27e8;
              if (local_27b0 < local_27e8) {
                uVar36 = local_27b0;
              }
              puVar26 = ringbuffer + uVar36 + (uVar40 & ringbuffer_mask);
              uVar34 = uVar24 - uVar36;
              if (7 < uVar34) {
                uVar41 = uVar34 & 0xfffffffffffffff8;
                lVar20 = 0;
                uVar35 = 0;
LAB_00122fa8:
                if (*(ulong *)(puVar26 + uVar35 * 8) ==
                    *(ulong *)(ringbuffer + uVar35 * 8 + uVar36 + uVar17)) goto code_r0x00122fb5;
                uVar41 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar36 + uVar17) ^
                         *(ulong *)(puVar26 + uVar35 * 8);
                uVar34 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar35 = (uVar34 >> 3 & 0x1fffffff) - lVar20;
                goto LAB_00122fe6;
              }
              uVar41 = 0;
              goto LAB_001230cf;
            }
          }
LAB_00122edd:
          if (0x7f < uVar24) {
            iVar15 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)&pHVar7->extra + local_2768 * 4) = iVar15;
LAB_00122f0a:
            *(int *)((long)&pHVar7->extra + local_2770 * 4) = iVar15;
          }
        }
LAB_0012310c:
        lVar30 = 3;
        auVar45 = _DAT_00176470;
        auVar46 = _DAT_00176460;
        do {
          if (SUB164(auVar45 ^ auVar49,4) == -0x80000000 &&
              SUB164(auVar45 ^ auVar49,0) < -0x7fffffda) {
            histogram_cmd[lVar30 + -3] = 0xfffffff;
            histogram_cmd[lVar30 + -2] = 0xfffffff;
          }
          if (SUB164(auVar46 ^ auVar49,4) == -0x80000000 &&
              SUB164(auVar46 ^ auVar49,0) < -0x7fffffda) {
            histogram_cmd[lVar30 + -1] = 0xfffffff;
            histogram_cmd[lVar30] = 0xfffffff;
          }
          lVar20 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 4;
          auVar45._8_8_ = lVar20 + 4;
          lVar20 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 4;
          auVar46._8_8_ = lVar20 + 4;
          lVar30 = lVar30 + 4;
        } while (lVar30 != 0x2b);
        uVar37 = uVar37 + 1;
        if (uVar37 < 5) {
          uVar37 = 4;
        }
        iVar15 = BrotliFindAllStaticDictionaryMatches
                           (&params->dictionary,ringbuffer + uVar17,uVar37,uVar24,histogram_cmd);
        auVar49 = _DAT_00176480;
        if (iVar15 != 0) {
          if (0x24 < uVar24) {
            uVar24 = 0x25;
          }
          if (uVar37 <= uVar24) {
            iVar15 = (int)uVar37 << 5;
            do {
              uVar14 = histogram_cmd[uVar37];
              if ((uVar14 < 0xfffffff) &&
                 (uVar27 = (ulong)(uVar14 >> 5) + uVar32 + 1, uVar27 <= (params->dist).max_distance)
                 ) {
                uVar14 = uVar14 & 0x1f;
                *local_2800 = (int)uVar27;
                if (uVar37 == uVar14) {
                  uVar14 = 0;
                }
                local_2800[1] = uVar14 + iVar15;
                local_2800 = local_2800 + 2;
              }
              uVar37 = uVar37 + 1;
              iVar15 = iVar15 + 0x20;
            } while (uVar24 + 1 != uVar37);
          }
        }
        lVar20 = (long)local_2800 - (long)puVar33 >> 3;
        *(int *)((long)local_2790 + lVar21 * 4) = (int)lVar20;
        lVar30 = lVar29;
        if (local_2800 != puVar33) {
          lVar30 = lVar20 + lVar29;
          uVar14 = *(uint *)((long)local_27a0 + lVar30 * 8 + -4);
          if (0x28bf < uVar14) {
            uVar17 = (ulong)(uVar14 >> 5);
            uVar27 = uVar28 + 1;
            uVar32 = uVar17 + uVar28;
            if ((long)pvVar25 + position <= uVar32) {
              uVar32 = (long)pvVar25 + position;
            }
            uVar18 = uVar32 - 0x3f;
            if (uVar32 < uVar28 + 0x40) {
              uVar18 = uVar27;
            }
            *(undefined8 *)((long)local_27a0 + lVar29 * 8) =
                 *(undefined8 *)((long)local_27a0 + lVar30 * 8 + -8);
            *(undefined4 *)((long)local_2790 + lVar21 * 4) = 1;
            if ((uVar28 + 0x201 <= uVar18) && (uVar27 < uVar18)) {
              uVar28 = (hasher->privat)._H5.bucket_size_;
              puVar6 = (hasher->privat)._H2.buckets_;
              pHVar7 = (hasher->privat)._H40.common;
              do {
                uVar24 = uVar27 & ringbuffer_mask;
                uVar14 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0xf;
                uVar19 = (ulong)puVar6[uVar14];
                local_27f8 = (uVar28 & uVar27) * 2 + 1;
                local_2808 = (uVar28 & uVar27) * 2;
                puVar6[uVar14] = (uint32_t)uVar27;
                if (uVar27 != uVar19) {
                  lVar30 = 0x40;
                  uVar37 = 0;
                  local_2800 = (undefined4 *)0x0;
LAB_00123473:
                  bVar43 = lVar30 != 0;
                  lVar30 = lVar30 + -1;
                  if ((uVar27 - uVar19 <= uVar28 - 0xf) && (bVar43)) {
                    puVar33 = (undefined4 *)uVar37;
                    if (local_2800 < uVar37) {
                      puVar33 = local_2800;
                    }
                    puVar26 = ringbuffer + (long)puVar33 + (uVar19 & ringbuffer_mask);
                    uVar40 = 0x80 - (long)puVar33;
                    if (7 < uVar40) {
                      uVar36 = uVar40 & 0xfffffffffffffff8;
                      lVar20 = 0;
                      uVar34 = 0;
LAB_001234df:
                      if (*(ulong *)(puVar26 + uVar34 * 8) ==
                          *(ulong *)(ringbuffer + uVar34 * 8 + (long)puVar33 + uVar24))
                      goto code_r0x001234ec;
                      uVar36 = *(ulong *)(ringbuffer + uVar34 * 8 + (long)puVar33 + uVar24) ^
                               *(ulong *)(puVar26 + uVar34 * 8);
                      uVar40 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar34 = (uVar40 >> 3 & 0x1fffffff) - lVar20;
                      goto LAB_0012352c;
                    }
                    uVar36 = 0;
                    goto LAB_00123598;
                  }
                }
LAB_0012341e:
                iVar15 = (hasher->privat)._H5.hash_shift_;
                *(int *)((long)&pHVar7->extra + local_2808 * 4) = iVar15;
LAB_00123431:
                *(int *)((long)&pHVar7->extra + local_27f8 * 4) = iVar15;
                uVar27 = uVar27 + 8;
              } while (uVar27 < uVar18);
            }
            if (uVar18 < uVar32) {
              uVar28 = (hasher->privat)._H5.bucket_size_;
              puVar6 = (hasher->privat)._H2.buckets_;
              pHVar7 = (hasher->privat)._H40.common;
              do {
                uVar27 = uVar18 & ringbuffer_mask;
                uVar14 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0xf;
                uVar24 = (ulong)puVar6[uVar14];
                local_27f8 = (uVar28 & uVar18) * 2 + 1;
                local_2808 = (uVar28 & uVar18) * 2;
                puVar6[uVar14] = (uint32_t)uVar18;
                if (uVar18 != uVar24) {
                  lVar30 = 0x40;
                  uVar19 = 0;
                  uVar37 = 0;
LAB_001236de:
                  bVar43 = lVar30 != 0;
                  lVar30 = lVar30 + -1;
                  if ((uVar18 - uVar24 <= uVar28 - 0xf) && (bVar43)) {
                    uVar40 = uVar37;
                    if (uVar19 < uVar37) {
                      uVar40 = uVar19;
                    }
                    puVar26 = ringbuffer + uVar40 + (uVar24 & ringbuffer_mask);
                    uVar36 = 0x80 - uVar40;
                    if (7 < uVar36) {
                      uVar34 = uVar36 & 0xfffffffffffffff8;
                      lVar20 = 0;
                      uVar41 = 0;
LAB_0012374d:
                      if (*(ulong *)(puVar26 + uVar41 * 8) ==
                          *(ulong *)(ringbuffer + uVar41 * 8 + uVar40 + uVar27))
                      goto code_r0x0012375a;
                      uVar34 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar40 + uVar27) ^
                               *(ulong *)(puVar26 + uVar41 * 8);
                      uVar36 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                        }
                      }
                      uVar41 = (uVar36 >> 3 & 0x1fffffff) - lVar20;
                      goto LAB_00123791;
                    }
                    uVar34 = 0;
                    goto LAB_001237fb;
                  }
                }
LAB_0012367a:
                iVar15 = (hasher->privat)._H5.hash_shift_;
                *(int *)((long)&pHVar7->extra + local_2808 * 4) = iVar15;
LAB_0012368d:
                *(int *)((long)&pHVar7->extra + local_27f8 * 4) = iVar15;
                uVar18 = uVar18 + 1;
              } while (uVar18 < uVar32);
            }
            lVar30 = uVar17 - 1;
            memset((void *)((long)local_2790 + lVar21 * 4 + 4),0,lVar30 * 4);
            lVar21 = lVar21 + lVar30;
            lVar30 = lVar29 + 1;
            auVar49 = _DAT_00176480;
          }
        }
        uVar28 = lVar21 + 4;
        lVar21 = lVar21 + 1;
        lVar29 = lVar30;
      } while (uVar28 < num_bytes);
    }
    else {
      bVar42 = false;
    }
  }
  sVar5 = *num_literals;
  sVar8 = *last_insert_len;
  uVar10 = *(undefined8 *)dist_cache;
  uVar11 = *(undefined8 *)(dist_cache + 2);
  sVar9 = *num_commands;
  lVar21 = num_bytes + 1;
  if (lVar21 == 0) {
    queue = (StartPosQueue *)0x0;
  }
  else {
    queue = (StartPosQueue *)BrotliAllocate(m,lVar21 * 0x10);
  }
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  pfVar1 = (float *)(queue->q_[0].distance_cache + 1);
  bVar43 = true;
  lVar29 = lVar21;
  pfVar13 = pfVar1;
  do {
    for (; lVar29 != 0; lVar29 = lVar29 + -1) {
      ((PosData *)(pfVar13 + -3))->pos = 1;
      (pfVar13 + -1)[0] = 0.0;
      (pfVar13 + -1)[1] = 1.7e+38;
      pfVar13 = pfVar13 + 4;
    }
    if (bVar43) {
      nodes = (ZopfliNode *)0x123a20;
      ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar23 = *num_commands;
      memset(histogram_literal,0,0x400);
      memset(histogram_cmd,0,0xb00);
      memset(histogram_dist,0,0x880);
      if (sVar23 != sVar9) {
        lVar29 = 0;
        uVar38 = position - sVar8;
        do {
          uVar32 = (ulong)commands[lVar29].insert_len_;
          uVar14 = commands[lVar29].copy_len_;
          uVar3 = commands[lVar29].dist_prefix_;
          uVar4 = commands[lVar29].cmd_prefix_;
          histogram_cmd[uVar4] = histogram_cmd[uVar4] + 1;
          uVar28 = uVar38;
          uVar27 = uVar32;
          if (0x7f < uVar4) {
            histogram_dist[uVar3 & 0x3ff] = histogram_dist[uVar3 & 0x3ff] + 1;
          }
          for (; uVar27 != 0; uVar27 = uVar27 - 1) {
            histogram_literal[ringbuffer[uVar28 & ringbuffer_mask]] =
                 histogram_literal[ringbuffer[uVar28 & ringbuffer_mask]] + 1;
            uVar28 = uVar28 + 1;
          }
          uVar38 = uVar38 + uVar32 + (ulong)(uVar14 & 0x1ffffff);
          lVar29 = lVar29 + 1;
        } while (lVar29 != sVar23 - sVar9);
      }
      SetCost(histogram_literal,0x100,1,cost_literal);
      SetCost(histogram_cmd,0x2c0,0,model.cost_cmd_);
      nodes = (ZopfliNode *)0x123b49;
      SetCost(histogram_dist,(ulong)model.distance_histogram_size,0,model.cost_dist_);
      model.min_cost_cmd_ = 1.7e+38;
      lVar29 = 0;
      do {
        if (model.cost_cmd_[lVar29] <= model.min_cost_cmd_) {
          model.min_cost_cmd_ = model.cost_cmd_[lVar29];
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 0x2c0);
      *model.literal_costs_ = 0.0;
      if (model.num_bytes_ != 0) {
        fVar44 = 0.0;
        sVar23 = 0;
        fVar47 = 0.0;
        do {
          fVar2 = cost_literal[ringbuffer[position + sVar23 & ringbuffer_mask]];
          fVar48 = fVar47 + fVar44 + fVar2;
          model.literal_costs_[sVar23 + 1] = fVar48;
          sVar23 = sVar23 + 1;
          fVar44 = (fVar44 + fVar2) - (fVar48 - fVar47);
          fVar47 = fVar48;
        } while (model.num_bytes_ != sVar23);
      }
    }
    *num_commands = sVar9;
    *num_literals = sVar5;
    *last_insert_len = sVar8;
    *(undefined8 *)dist_cache = uVar10;
    *(undefined8 *)(dist_cache + 2) = uVar11;
    iVar15 = params->lgwin;
    sVar23 = params->stream_offset;
    uVar14 = 0x145;
    if (params->quality < 0xb) {
      uVar14 = 0x96;
    }
    *(undefined4 *)&queue->q_[0].pos = 0;
    queue->q_[0].distance_cache[1] = 0;
    histogram_cmd[0x40] = 0;
    histogram_cmd[0x41] = 0;
    if (bVar42) {
      max_backward_limit = (1L << ((byte)iVar15 & 0x3f)) - 0x10;
      lVar29 = 0;
      pos = 0;
      do {
        sVar22 = UpdateNodes(num_bytes,position,pos,ringbuffer,ringbuffer_mask,params,
                             max_backward_limit,dist_cache,
                             (ulong)*(uint *)((long)local_2790 + pos * 4),
                             (BackwardMatch *)((long)local_27a0 + lVar29 * 8),&model,
                             (StartPosQueue *)histogram_cmd,(ZopfliNode *)queue);
        uVar38 = 0;
        if (0x3fff < sVar22) {
          uVar38 = sVar22;
        }
        uVar28 = (ulong)*(uint *)((long)local_2790 + pos * 4);
        lVar29 = lVar29 + uVar28;
        if (((uVar28 == 1) &&
            (uVar16 = *(uint *)((long)local_27a0 + lVar29 * 8 + -4) >> 5, uVar14 < uVar16)) &&
           (uVar38 < uVar16)) {
          uVar38 = (ulong)uVar16;
        }
        if (1 < uVar38) {
          lVar30 = uVar38 - 1;
          uVar38 = pos + 4;
          do {
            pos = uVar38 - 3;
            if (num_bytes <= uVar38) break;
            EvaluateNode(sVar23 + position,pos,max_backward_limit,(size_t)dist_cache,(int *)&model,
                         (ZopfliCostModel *)histogram_cmd,queue,nodes);
            lVar29 = lVar29 + (ulong)*(uint *)((long)local_2790 + uVar38 * 4 + -0xc);
            uVar38 = uVar38 + 1;
            lVar30 = lVar30 + -1;
          } while (lVar30 != 0);
        }
        uVar38 = pos + 4;
        pos = pos + 1;
      } while (uVar38 < num_bytes);
    }
    sVar23 = ComputeShortestPathFromNodes(num_bytes,(ZopfliNode *)queue);
    *num_commands = *num_commands + sVar23;
    BrotliZopfliCreateCommands
              (num_bytes,position,(ZopfliNode *)queue,dist_cache,last_insert_len,params,commands,
               num_literals);
    bVar12 = !bVar43;
    bVar43 = false;
    lVar29 = lVar21;
    pfVar13 = pfVar1;
    if (bVar12) {
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,model.cost_dist_);
      model.cost_dist_ = (float *)0x0;
      BrotliFree(m,queue);
      BrotliFree(m,local_27a0);
      BrotliFree(m,local_2790);
      return;
    }
  } while( true );
code_r0x00122dc5:
  uVar34 = uVar34 + 1;
  lVar30 = lVar30 + -8;
  puVar31 = puVar26 + (uVar24 & 0xfffffffffffffff8);
  uVar41 = uVar24 & 0xfffffffffffffff8;
  if (uVar24 >> 3 == uVar34) goto LAB_00122e34;
  goto LAB_00122db8;
code_r0x00122fb5:
  uVar35 = uVar35 + 1;
  lVar20 = lVar20 + -8;
  if (uVar34 >> 3 == uVar35) goto code_r0x00122fc1;
  goto LAB_00122fa8;
code_r0x00122fc1:
  puVar26 = puVar26 + -lVar20;
LAB_001230cf:
  uVar34 = uVar34 & 7;
  uVar35 = uVar41;
  if (uVar34 != 0) {
    uVar39 = uVar41 | uVar34;
    do {
      uVar35 = uVar41;
      if (ringbuffer[uVar41 + uVar36 + uVar17] != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar41 = uVar41 + 1;
      uVar34 = uVar34 - 1;
      uVar35 = uVar39;
    } while (uVar34 != 0);
  }
LAB_00122fe6:
  uVar35 = uVar35 + uVar36;
  if (local_2800 == (undefined4 *)0x0) {
    local_2800 = (undefined4 *)0x0;
  }
  else if (uVar37 < uVar35) {
    *local_2800 = (int)(uVar28 - uVar40);
    local_2800[1] = (int)uVar35 << 5;
    local_2800 = local_2800 + 2;
    uVar37 = uVar35;
  }
  if (uVar19 <= uVar35) {
    if (uVar24 < 0x80) goto LAB_0012310c;
    *(undefined4 *)((long)&pHVar7->extra + local_2768 * 4) =
         *(undefined4 *)(&pHVar7->extra + (uVar40 & uVar18));
    iVar15 = *(int *)((long)&pHVar7->extra + (uVar40 & uVar18) * 8 + 4);
    goto LAB_00122f0a;
  }
  if (ringbuffer[uVar35 + (uVar40 & ringbuffer_mask)] < ringbuffer[uVar35 + uVar17]) {
    if (0x7f < uVar24) {
      *(int *)((long)&pHVar7->extra + local_2768 * 4) = (int)uVar40;
    }
    lVar20 = (uVar40 & uVar18) * 2 + 1;
    local_27b0 = uVar35;
    local_2768 = lVar20;
  }
  else {
    if (0x7f < uVar24) {
      *(int *)((long)&pHVar7->extra + local_2770 * 4) = (int)uVar40;
    }
    lVar20 = (uVar40 & uVar18) * 2;
    local_27e8 = uVar35;
    local_2770 = lVar20;
  }
  uVar40 = (ulong)*(uint *)((long)&pHVar7->extra + lVar20 * 4);
  if (uVar28 == uVar40) goto LAB_00122edd;
  goto LAB_00122f42;
code_r0x001234ec:
  uVar34 = uVar34 + 1;
  lVar20 = lVar20 + -8;
  if (uVar40 >> 3 == uVar34) goto code_r0x001234f8;
  goto LAB_001234df;
code_r0x001234f8:
  puVar26 = puVar26 + -lVar20;
LAB_00123598:
  uVar40 = uVar40 & 7;
  uVar34 = uVar36;
  if (uVar40 != 0) {
    uVar41 = uVar36 | uVar40;
    do {
      uVar34 = uVar36;
      if (ringbuffer[uVar36 + (long)puVar33 + uVar24] != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar36 = uVar36 + 1;
      uVar40 = uVar40 - 1;
      uVar34 = uVar41;
    } while (uVar40 != 0);
  }
LAB_0012352c:
  uVar34 = uVar34 + (long)puVar33;
  if (0x7f < uVar34) {
    *(undefined4 *)((long)&pHVar7->extra + local_2808 * 4) =
         *(undefined4 *)(&pHVar7->extra + (uVar19 & uVar28));
    iVar15 = *(int *)((long)&pHVar7->extra + (uVar19 & uVar28) * 8 + 4);
    goto LAB_00123431;
  }
  uVar40 = (uVar19 & uVar28) * 2;
  if (ringbuffer[uVar34 + (uVar19 & ringbuffer_mask)] < ringbuffer[uVar34 + uVar24]) {
    *(int *)((long)&pHVar7->extra + local_2808 * 4) = (int)uVar19;
    uVar40 = uVar40 | 1;
    local_2808 = uVar40;
    local_2800 = (undefined4 *)uVar34;
  }
  else {
    *(int *)((long)&pHVar7->extra + local_27f8 * 4) = (int)uVar19;
    uVar37 = uVar34;
    local_27f8 = uVar40;
  }
  uVar19 = (ulong)*(uint *)((long)&pHVar7->extra + uVar40 * 4);
  if (uVar27 == uVar19) goto LAB_0012341e;
  goto LAB_00123473;
code_r0x0012375a:
  uVar41 = uVar41 + 1;
  lVar20 = lVar20 + -8;
  if (uVar36 >> 3 == uVar41) goto code_r0x00123766;
  goto LAB_0012374d;
code_r0x00123766:
  puVar26 = puVar26 + -lVar20;
LAB_001237fb:
  uVar36 = uVar36 & 7;
  uVar41 = uVar34;
  if (uVar36 != 0) {
    uVar35 = uVar34 | uVar36;
    do {
      uVar41 = uVar34;
      if (ringbuffer[uVar34 + uVar40 + uVar27] != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar34 = uVar34 + 1;
      uVar36 = uVar36 - 1;
      uVar41 = uVar35;
    } while (uVar36 != 0);
  }
LAB_00123791:
  uVar41 = uVar41 + uVar40;
  if (0x7f < uVar41) {
    *(undefined4 *)((long)&pHVar7->extra + local_2808 * 4) =
         *(undefined4 *)(&pHVar7->extra + (uVar24 & uVar28));
    iVar15 = *(int *)((long)&pHVar7->extra + (uVar24 & uVar28) * 8 + 4);
    goto LAB_0012368d;
  }
  uVar40 = (uVar24 & uVar28) * 2;
  if (ringbuffer[uVar41 + (uVar24 & ringbuffer_mask)] < ringbuffer[uVar41 + uVar27]) {
    *(int *)((long)&pHVar7->extra + local_2808 * 4) = (int)uVar24;
    uVar40 = uVar40 | 1;
    uVar19 = uVar41;
    uVar41 = uVar37;
    local_2808 = uVar40;
  }
  else {
    *(int *)((long)&pHVar7->extra + local_27f8 * 4) = (int)uVar24;
    local_27f8 = uVar40;
  }
  uVar24 = (ulong)*(uint *)((long)&pHVar7->extra + uVar40 * 4);
  uVar37 = uVar41;
  if (uVar18 == uVar24) goto LAB_0012367a;
  goto LAB_001236de;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  BROTLI_UNUSED(literal_context_lut);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(num_matches) ||
      BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, &model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}